

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O2

void __thiscall
node::BlockAssembler::addPackageTxs
          (BlockAssembler *this,CTxMemPool *mempool,int *nPackagesSelected,int *nDescendantsUpdated)

{
  long lVar1;
  pointer poVar2;
  long lVar3;
  long lVar4;
  update_for_parent_inclusion mod;
  long *plVar5;
  long *plVar6;
  bool bVar7;
  bool bVar8;
  size_type sVar9;
  size_type sVar10;
  size_type sVar11;
  CAmount CVar12;
  size_type sVar13;
  iterator position;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *phVar16;
  long *plVar17;
  BlockAssembler *this_00;
  int iVar18;
  size_t i;
  ulong uVar19;
  iterator position_00;
  long lVar20;
  long in_FS_OFFSET;
  string_view calling_fn_name;
  pair<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>_*,_bool>
  pVar21;
  long local_170;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  sortedEntries;
  txiter iter;
  iterator mi;
  type it;
  txiter desc;
  setEntries ancestors;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  failedTx;
  indexed_modified_transaction_set mapModifiedTx;
  setEntries descendants;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  boost::multi_index::
  multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
  ::multi_index_container(&mapModifiedTx);
  failedTx._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &failedTx._M_t._M_impl.super__Rb_tree_header._M_header;
  failedTx._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  failedTx._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  failedTx._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  poVar2 = *(pointer *)
            ((long)&(((mempool->mapTx).
                      super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                     .member)->
                    super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                    ).
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                    .
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                    .
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                    .
                    super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                    .
                    super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                    .
                    super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
            + 8);
  mi.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
             *)&poVar2[-0xc].
                super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                .super_type.right_;
  if (poVar2 == (pointer)0x0) {
    mi.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
               *)0x0;
  }
  local_170 = 0;
  failedTx._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       failedTx._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_007aec48:
  do {
    while (phVar16 = (mempool->mapTx).
                     super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                     .member,
          (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
           *)mi.node != phVar16) {
      it.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                 *)mi.node;
      sVar9 = boost::multi_index::detail::
              ordered_index_impl<node::modifiedentry_iter,node::CompareCTxMemPoolIter,boost::multi_index::detail::nth_layer<1,node::CTxMemPoolModifiedEntry,node::CTxMemPoolModifiedEntry_Indices,std::allocator<node::CTxMemPoolModifiedEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
              ::
              count<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>
                        ((ordered_index_impl<node::modifiedentry_iter,node::CompareCTxMemPoolIter,boost::multi_index::detail::nth_layer<1,node::CTxMemPoolModifiedEntry,node::CTxMemPoolModifiedEntry_Indices,std::allocator<node::CTxMemPoolModifiedEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                          *)&mapModifiedTx.super_type,&it);
      if (sVar9 == 0) {
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&descendants,
                   (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)it.node);
        sVar10 = std::
                 _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count(&(this->inBlock)._M_h,(key_type *)(descendants._M_t._M_impl._0_8_ + 0x39));
        if (sVar10 == 0) {
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&ancestors,
                     (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)it.node);
          sVar11 = std::
                   set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   ::count(&failedTx,(key_type *)(ancestors._M_t._M_impl._0_8_ + 0x39));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &ancestors._M_t._M_impl.super__Rb_tree_header);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &descendants._M_t._M_impl.super__Rb_tree_header);
          if (sVar11 == 0) {
            phVar16 = (mempool->mapTx).
                      super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                      .member;
            goto LAB_007aed29;
          }
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &descendants._M_t._M_impl.super__Rb_tree_header);
        }
      }
      boost::multi_index::detail::
      ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
      ::increment(&mi.node);
    }
    if (mapModifiedTx.node_count == 0) goto LAB_007af1cc;
LAB_007aed29:
    poVar2 = ((mapModifiedTx.
               super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>_*,_boost::multi_index::multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
              .member)->
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
             ).
             super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
             .
             super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .
             super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .super_type.left_;
    position_00.node =
         (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
          *)&poVar2[-2].
             super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .super_type.right_;
    if (poVar2 == (pointer)0x0) {
      position_00.node =
           (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
            *)0x0;
    }
    if ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
         *)mi.node == phVar16) {
LAB_007aed91:
      iter.node = *(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                    **)&((position_00.node)->
                        super_index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                        ).super_pod_value_holder<node::CTxMemPoolModifiedEntry>.space.data_.align_;
      bVar7 = true;
    }
    else {
      iter.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                   *)mi.node;
      if ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>
           *)position_00.node !=
          mapModifiedTx.
          super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>_*,_boost::multi_index::multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
          .member) {
        descendants._M_t._M_impl._0_8_ = mi.node;
        descendants._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             *(undefined8 *)
              ((long)&((mi.node)->
                      super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>).
                      super_pod_value_holder<CTxMemPoolEntry>.space.data_ + 0xe8);
        descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             *(_Base_ptr *)
              ((long)&((mi.node)->
                      super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>).
                      super_pod_value_holder<CTxMemPoolEntry>.space.data_ + 0xf0);
        descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             *(_Base_ptr *)
              ((long)&((mi.node)->
                      super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>).
                      super_pod_value_holder<CTxMemPoolEntry>.space.data_ + 0xf8);
        bVar7 = CompareTxMemPoolEntryByAncestorFee::operator()
                          ((CompareTxMemPoolEntryByAncestorFee *)&ancestors,
                           (CTxMemPoolModifiedEntry *)position_00.node,
                           (CTxMemPoolModifiedEntry *)&descendants);
        if (bVar7) goto LAB_007aed91;
      }
      boost::multi_index::detail::
      ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
      ::increment(&mi.node);
      bVar7 = false;
    }
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&descendants,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)iter.node);
    sVar10 = std::
             _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::count(&(this->inBlock)._M_h,(key_type *)(descendants._M_t._M_impl._0_8_ + 0x39));
    if (sVar10 != 0) {
      __assert_fail("!inBlock.count(iter->GetSharedTx()->GetHash())",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
                    ,0x16d,
                    "void node::BlockAssembler::addPackageTxs(const CTxMemPool &, int &, int &)");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &descendants._M_t._M_impl.super__Rb_tree_header);
    plVar17 = (long *)((long)&((position_00.node)->
                              super_index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                              ).super_pod_value_holder<node::CTxMemPoolModifiedEntry>.space.data_ +
                      8);
    plVar5 = (long *)((long)&((position_00.node)->
                             super_index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                             ).super_pod_value_holder<node::CTxMemPoolModifiedEntry>.space.data_ +
                     0x18);
    plVar6 = (long *)((long)&((position_00.node)->
                             super_index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                             ).super_pod_value_holder<node::CTxMemPoolModifiedEntry>.space.data_ +
                     0x10);
    if (!bVar7) {
      plVar17 = (long *)((long)&((iter.node)->
                                super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                ).
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                .
                                super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                .super_pod_value_holder<CTxMemPoolEntry>.space + 0xe8);
      plVar5 = (long *)((long)&((iter.node)->
                               super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                               .
                               super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                               .super_pod_value_holder<CTxMemPoolEntry>.space + 0xf8);
      plVar6 = (long *)((long)&((iter.node)->
                               super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                               .
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                               .
                               super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                               .super_pod_value_holder<CTxMemPoolEntry>.space + 0xf0);
    }
    lVar20 = *plVar17;
    lVar3 = *plVar6;
    lVar4 = *plVar5;
    CVar12 = CFeeRate::GetFee(&(this->m_options).blockMinFeeRate,(uint32_t)lVar20);
    if (lVar3 < CVar12) goto LAB_007af1cc;
    if ((lVar20 * 4 + this->nBlockWeight < (this->m_options).nBlockMaxWeight) &&
       (lVar4 + this->nBlockSigOpsCost < 80000)) {
      descendants._M_t._M_impl._0_8_ = 0x7fffffffffffffff;
      descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
      descendants._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x7fffffff;
      descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x7fffffffffffffff;
      descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x7fffffffffffffff;
      calling_fn_name._M_str = "addPackageTxs";
      calling_fn_name._M_len = 0xd;
      CTxMemPool::AssumeCalculateMemPoolAncestors
                (&ancestors,mempool,calling_fn_name,(CTxMemPoolEntry *)iter.node,
                 (Limits *)&descendants,false);
      onlyUnconfirmed(this,&ancestors);
      std::
      _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<...lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
      ::
      _M_insert_unique<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>const&>
                ((_Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                  *)&ancestors,&iter);
      this_00 = this;
      bVar8 = TestPackageTransactions(this,&ancestors);
      if (bVar8) {
        sortedEntries.
        super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sortedEntries.
        super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sortedEntries.
        super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SortForBlock(this_00,&ancestors,&sortedEntries);
        lVar20 = 0;
        for (uVar19 = 0;
            uVar19 < (ulong)((long)sortedEntries.
                                   super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)sortedEntries.
                                   super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar19 = uVar19 + 1) {
          AddToBlock(this,*(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                            **)((long)&(sortedEntries.
                                        super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->node + lVar20));
          boost::multi_index::detail::
          ordered_index_impl<node::modifiedentry_iter,_node::CompareCTxMemPoolIter,_boost::multi_index::detail::nth_layer<1,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::erase(&mapModifiedTx.super_type.super_type,
                  (key_param_type)
                  ((long)&(sortedEntries.
                           super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->node + lVar20));
          lVar20 = lVar20 + 8;
        }
        *nPackagesSelected = *nPackagesSelected + 1;
        iVar18 = 0;
        for (p_Var15 = ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != &ancestors._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15)) {
          mod.iter.node = *(txiter *)(p_Var15 + 1);
          descendants._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               descendants._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &descendants._M_t._M_impl.super__Rb_tree_header._M_header;
          descendants._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          CTxMemPool::CalculateDescendants(mempool,mod.iter.node,&descendants);
          for (p_Var14 = descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != &descendants._M_t._M_impl.super__Rb_tree_header;
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14)) {
            desc.node = *(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                          **)(p_Var14 + 1);
            sVar13 = std::
                     set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                     ::count((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              *)&ancestors,&desc);
            if (sVar13 == 0) {
              position = boost::multi_index::detail::
                         ordered_index_impl<node::modifiedentry_iter,node::CompareCTxMemPoolIter,boost::multi_index::detail::nth_layer<1,node::CTxMemPoolModifiedEntry,node::CTxMemPoolModifiedEntry_Indices,std::allocator<node::CTxMemPoolModifiedEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                         ::
                         find<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>
                                   ((ordered_index_impl<node::modifiedentry_iter,node::CompareCTxMemPoolIter,boost::multi_index::detail::nth_layer<1,node::CTxMemPoolModifiedEntry,node::CTxMemPoolModifiedEntry_Indices,std::allocator<node::CTxMemPoolModifiedEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                                     *)&mapModifiedTx.super_type,&desc);
              if (position.node ==
                  mapModifiedTx.
                  super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>_*,_boost::multi_index::multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
                  .member) {
                it.node = desc.node;
                pVar21 = boost::multi_index::
                         multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                         ::insert_<boost::multi_index::detail::lvalue_tag>(&mapModifiedTx,&it);
                position.node = pVar21.first;
              }
              boost::multi_index::detail::
              ordered_index_impl<node::modifiedentry_iter,_node::CompareCTxMemPoolIter,_boost::multi_index::detail::nth_layer<1,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
              ::modify<node::update_for_parent_inclusion>
                        (&mapModifiedTx.super_type.super_type,position,mod);
              iVar18 = iVar18 + 1;
            }
          }
          std::_Rb_tree<$270907ca$>::~_Rb_tree(&descendants._M_t);
        }
        *nDescendantsUpdated = *nDescendantsUpdated + iVar18;
        std::
        _Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ::~_Vector_base(&sortedEntries.
                         super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                       );
        local_170 = 0;
      }
      else if (bVar7) {
        boost::multi_index::detail::
        ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
        ::erase((ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 *)&mapModifiedTx.super_type,position_00);
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&descendants,
                   (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)iter.node);
        std::
        _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
        ::_M_insert_unique<transaction_identifier<false>const&>
                  ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                    *)&failedTx,
                   (transaction_identifier<false> *)(descendants._M_t._M_impl._0_8_ + 0x39));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &descendants._M_t._M_impl.super__Rb_tree_header);
      }
      std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&ancestors);
      goto LAB_007aec48;
    }
    if (bVar7) {
      boost::multi_index::detail::
      ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
      ::erase((ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
               *)&mapModifiedTx.super_type,position_00);
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&descendants,
                 (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)iter.node);
      std::
      _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
      ::_M_insert_unique<transaction_identifier<false>const&>
                ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                  *)&failedTx,
                 (transaction_identifier<false> *)(descendants._M_t._M_impl._0_8_ + 0x39));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &descendants._M_t._M_impl.super__Rb_tree_header);
    }
    lVar20 = local_170 + 1;
    bVar7 = 999 < local_170;
    local_170 = lVar20;
    if ((bVar7) &&
       ((this->m_options).nBlockMaxWeight -
        (this->m_options).super_BlockCreateOptions.coinbase_max_additional_weight <
        this->nBlockWeight)) {
LAB_007af1cc:
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree(&failedTx._M_t);
      boost::multi_index::
      multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
      ::~multi_index_container(&mapModifiedTx);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void BlockAssembler::addPackageTxs(const CTxMemPool& mempool, int& nPackagesSelected, int& nDescendantsUpdated)
{
    AssertLockHeld(mempool.cs);

    // mapModifiedTx will store sorted packages after they are modified
    // because some of their txs are already in the block
    indexed_modified_transaction_set mapModifiedTx;
    // Keep track of entries that failed inclusion, to avoid duplicate work
    std::set<Txid> failedTx;

    CTxMemPool::indexed_transaction_set::index<ancestor_score>::type::iterator mi = mempool.mapTx.get<ancestor_score>().begin();
    CTxMemPool::txiter iter;

    // Limit the number of attempts to add transactions to the block when it is
    // close to full; this is just a simple heuristic to finish quickly if the
    // mempool has a lot of entries.
    const int64_t MAX_CONSECUTIVE_FAILURES = 1000;
    int64_t nConsecutiveFailed = 0;

    while (mi != mempool.mapTx.get<ancestor_score>().end() || !mapModifiedTx.empty()) {
        // First try to find a new transaction in mapTx to evaluate.
        //
        // Skip entries in mapTx that are already in a block or are present
        // in mapModifiedTx (which implies that the mapTx ancestor state is
        // stale due to ancestor inclusion in the block)
        // Also skip transactions that we've already failed to add. This can happen if
        // we consider a transaction in mapModifiedTx and it fails: we can then
        // potentially consider it again while walking mapTx.  It's currently
        // guaranteed to fail again, but as a belt-and-suspenders check we put it in
        // failedTx and avoid re-evaluation, since the re-evaluation would be using
        // cached size/sigops/fee values that are not actually correct.
        /** Return true if given transaction from mapTx has already been evaluated,
         * or if the transaction's cached data in mapTx is incorrect. */
        if (mi != mempool.mapTx.get<ancestor_score>().end()) {
            auto it = mempool.mapTx.project<0>(mi);
            assert(it != mempool.mapTx.end());
            if (mapModifiedTx.count(it) || inBlock.count(it->GetSharedTx()->GetHash()) || failedTx.count(it->GetSharedTx()->GetHash())) {
                ++mi;
                continue;
            }
        }

        // Now that mi is not stale, determine which transaction to evaluate:
        // the next entry from mapTx, or the best from mapModifiedTx?
        bool fUsingModified = false;

        modtxscoreiter modit = mapModifiedTx.get<ancestor_score>().begin();
        if (mi == mempool.mapTx.get<ancestor_score>().end()) {
            // We're out of entries in mapTx; use the entry from mapModifiedTx
            iter = modit->iter;
            fUsingModified = true;
        } else {
            // Try to compare the mapTx entry to the mapModifiedTx entry
            iter = mempool.mapTx.project<0>(mi);
            if (modit != mapModifiedTx.get<ancestor_score>().end() &&
                    CompareTxMemPoolEntryByAncestorFee()(*modit, CTxMemPoolModifiedEntry(iter))) {
                // The best entry in mapModifiedTx has higher score
                // than the one from mapTx.
                // Switch which transaction (package) to consider
                iter = modit->iter;
                fUsingModified = true;
            } else {
                // Either no entry in mapModifiedTx, or it's worse than mapTx.
                // Increment mi for the next loop iteration.
                ++mi;
            }
        }

        // We skip mapTx entries that are inBlock, and mapModifiedTx shouldn't
        // contain anything that is inBlock.
        assert(!inBlock.count(iter->GetSharedTx()->GetHash()));

        uint64_t packageSize = iter->GetSizeWithAncestors();
        CAmount packageFees = iter->GetModFeesWithAncestors();
        int64_t packageSigOpsCost = iter->GetSigOpCostWithAncestors();
        if (fUsingModified) {
            packageSize = modit->nSizeWithAncestors;
            packageFees = modit->nModFeesWithAncestors;
            packageSigOpsCost = modit->nSigOpCostWithAncestors;
        }

        if (packageFees < m_options.blockMinFeeRate.GetFee(packageSize)) {
            // Everything else we might consider has a lower fee rate
            return;
        }

        if (!TestPackage(packageSize, packageSigOpsCost)) {
            if (fUsingModified) {
                // Since we always look at the best entry in mapModifiedTx,
                // we must erase failed entries so that we can consider the
                // next best entry on the next loop iteration
                mapModifiedTx.get<ancestor_score>().erase(modit);
                failedTx.insert(iter->GetSharedTx()->GetHash());
            }

            ++nConsecutiveFailed;

            if (nConsecutiveFailed > MAX_CONSECUTIVE_FAILURES && nBlockWeight >
                    m_options.nBlockMaxWeight - m_options.coinbase_max_additional_weight) {
                // Give up if we're close to full and haven't succeeded in a while
                break;
            }
            continue;
        }

        auto ancestors{mempool.AssumeCalculateMemPoolAncestors(__func__, *iter, CTxMemPool::Limits::NoLimits(), /*fSearchForParents=*/false)};

        onlyUnconfirmed(ancestors);
        ancestors.insert(iter);

        // Test if all tx's are Final
        if (!TestPackageTransactions(ancestors)) {
            if (fUsingModified) {
                mapModifiedTx.get<ancestor_score>().erase(modit);
                failedTx.insert(iter->GetSharedTx()->GetHash());
            }
            continue;
        }

        // This transaction will make it in; reset the failed counter.
        nConsecutiveFailed = 0;

        // Package can be added. Sort the entries in a valid order.
        std::vector<CTxMemPool::txiter> sortedEntries;
        SortForBlock(ancestors, sortedEntries);

        for (size_t i = 0; i < sortedEntries.size(); ++i) {
            AddToBlock(sortedEntries[i]);
            // Erase from the modified set, if present
            mapModifiedTx.erase(sortedEntries[i]);
        }

        ++nPackagesSelected;

        // Update transactions that depend on each of these
        nDescendantsUpdated += UpdatePackagesForAdded(mempool, ancestors, mapModifiedTx);
    }
}